

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>::AttachmentPromiseNode
          (AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_> *this,
          OwnPromiseNode *dependency,Deferred<kj::Function<void_()>_> *attachment)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *dependencyParam;
  Deferred<kj::Function<void_()>_> *pDVar1;
  Deferred<kj::Function<void_()>_> *attachment_local;
  OwnPromiseNode *dependency_local;
  AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_> *this_local;
  
  dependencyParam = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(dependency);
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependencyParam);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00c0c7b8;
  pDVar1 = mv<kj::_::Deferred<kj::Function<void()>>>(attachment);
  Deferred<kj::Function<void_()>_>::Deferred(&this->attachment,pDVar1);
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}